

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vao.cpp
# Opt level: O1

void __thiscall
graphics101::VertexAndFaceArrays::uploadFaces
          (VertexAndFaceArrays *this,GLint *face_indices,int num_face_indices,GLenum mode)

{
  undefined8 in_RAX;
  GLuint FBO;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  if (num_face_indices < 1) {
    __assert_fail("num_face_indices > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/vao.cpp"
                  ,0xaf,
                  "void graphics101::VertexAndFaceArrays::uploadFaces(const GLint *, int, GLenum)");
  }
  if (face_indices != (GLint *)0x0) {
    this->m_mode = mode;
    this->m_num_face_indices = num_face_indices;
    (*gl3wProcs.ptr[0x1a])((ulong)this->m_VAO);
    (*gl3wProcs.ptr[0xab])(1,&local_24);
    (*gl3wProcs.ptr[8])(0x8893,(ulong)local_24);
    (*gl3wProcs.ptr[0x28])(0x8893,(ulong)(uint)num_face_indices << 2,face_indices,0x88e4);
    (*gl3wProcs.ptr[0x1a])(0);
    (*gl3wProcs.ptr[0x6a])(1,&local_24);
    return;
  }
  __assert_fail("face_indices",
                "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/vao.cpp"
                ,0xb0,
                "void graphics101::VertexAndFaceArrays::uploadFaces(const GLint *, int, GLenum)");
}

Assistant:

void VertexAndFaceArrays::uploadFaces( const GLint* face_indices, int num_face_indices, GLenum mode ) {
    assert( num_face_indices > 0 );
    assert( face_indices );
    
    // Remember what kind and how many indices there are.
    m_mode = mode;
    m_num_face_indices = num_face_indices;
    
    // Bind the Vertex Array Object
	glBindVertexArray( m_VAO );
	
    // Generate a GPU buffer
	GLuint FBO;
	glGenBuffers( 1, &FBO );
	
	// Bind the buffer
    glBindBuffer( GL_ELEMENT_ARRAY_BUFFER, FBO );
    // Upload the data
    glBufferData( GL_ELEMENT_ARRAY_BUFFER,
                 sizeof( GLint )*num_face_indices,
                 face_indices,
                 GL_STATIC_DRAW
                 );
	
	// Unlike attributes, the last bound face data is stored with the VAO.
	// We don't need to call anything else.
	
	// Unbind the VAO so we can delete the face buffer.
    glBindVertexArray( 0 );
    
    // Delete the face buffer. This won't actually delete it until we delete the VAO.
    glDeleteBuffers( 1, &FBO );
}